

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpmMig.c
# Opt level: O3

Mig_Man_t * Mig_ManStart(void)

{
  Mig_Man_t *pMVar1;
  int *piVar2;
  undefined8 *puVar3;
  void **ppvVar4;
  
  pMVar1 = (Mig_Man_t *)calloc(1,0xb0);
  piVar2 = (int *)malloc(0x1000);
  (pMVar1->vCis).pArray = piVar2;
  if (piVar2 != (int *)0x0) {
    (pMVar1->vCis).nCap = 0x400;
    piVar2 = (int *)malloc(0x1000);
    (pMVar1->vCos).pArray = piVar2;
    if (piVar2 != (int *)0x0) {
      (pMVar1->vCos).nCap = 0x400;
      puVar3 = (undefined8 *)malloc(0x10020);
      memset(puVar3 + 1,0xff,0x10018);
      *puVar3 = pMVar1;
      ppvVar4 = (void **)malloc(0x80);
      (pMVar1->vPages).pArray = ppvVar4;
      (pMVar1->vPages).nCap = 0x10;
      (pMVar1->vPages).nSize = 1;
      *ppvVar4 = puVar3 + 2;
      pMVar1->nObjs = 1;
      if (0xfffffffd < *(uint *)((long)puVar3 + 0x1c)) {
        *(uint *)((long)puVar3 + 0x1c) = *(uint *)((long)puVar3 + 0x1c) & 1;
        return pMVar1;
      }
      __assert_fail("Mig_ObjIsNone(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/mpm/mpmMig.h"
                    ,0xea,"Mig_Obj_t *Mig_ManAppendObj(Mig_Man_t *)");
    }
  }
  __assert_fail("p->pArray",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    []

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
Mig_Man_t * Mig_ManStart()
{
    Mig_Man_t * p;
    assert( sizeof(Mig_Obj_t) >= 16 );
    assert( (1 << MIG_BASE) == MIG_MASK + 1 );
    p = ABC_CALLOC( Mig_Man_t, 1 );
    Vec_IntGrow( &p->vCis, 1024 );
    Vec_IntGrow( &p->vCos, 1024 );
    Mig_ManAppendObj( p ); // const0
    return p;
}